

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle-foreach.h
# Opt level: O0

void rtosc::
     bundle_foreach<void(*)(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)>
               (Port *p,char *name,char *old_end,char *name_buffer,size_t buffer_size,Ports *base,
               void *data,void *runtime,
               _func_void_Port_ptr_char_ptr_char_ptr_Ports_ptr_void_ptr_void_ptr **ftor,
               bool expand_bundles,bool cut_afterwards,bool ranges)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  char *pcVar3;
  char *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 *in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  char *name2_2;
  uint i;
  char *name_precheck;
  char *pos2;
  uint iterations;
  uint max;
  char *pos;
  ssize_t space_left;
  char *local_a8;
  uint local_8c;
  char *local_78;
  uint local_6c;
  char *local_68;
  char *local_60;
  char *local_50;
  char *local_18;
  
  local_50 = in_RDX;
  local_18 = in_RSI;
  while (*local_18 != '#') {
    *local_50 = *local_18;
    local_50 = local_50 + 1;
    local_18 = local_18 + 1;
  }
  uVar1 = atoi(local_18 + 1);
  if (((in_stack_00000020 & 1) == 0) || (local_8c = uVar1, ((byte)name2_2 & 1) != 0)) {
    local_8c = 1;
  }
  do {
    pcVar3 = local_18 + 1;
    iVar2 = isdigit((int)local_18[1]);
    local_18 = pcVar3;
  } while (iVar2 != 0);
  local_60 = local_50;
  local_68 = pcVar3;
  while( true ) {
    bVar4 = false;
    if (*local_68 != '\0') {
      bVar4 = *local_68 != ':';
    }
    if (!bVar4) break;
    local_68 = local_68 + 1;
  }
  for (local_6c = 0; local_6c < local_8c; local_6c = local_6c + 1) {
    local_78 = pcVar3;
    if (((byte)name2_2 & 1) == 0) {
      if ((in_stack_00000020 & 1) != 0) {
        iVar2 = snprintf(local_50,0x10,"%d",(ulong)local_6c);
        local_60 = local_50 + iVar2;
      }
    }
    else {
      iVar2 = snprintf(local_50,0x10,"[0,%d]",(ulong)(uVar1 - 1));
      local_60 = local_60 + iVar2;
    }
    while( true ) {
      bVar4 = false;
      if (*local_78 != '\0') {
        bVar4 = *local_78 != ':';
      }
      if (!bVar4) break;
      *local_60 = *local_78;
      local_78 = local_78 + 1;
      local_60 = local_60 + 1;
    }
    *local_60 = '\0';
    (*(code *)*in_stack_00000018)(in_RDI,in_RCX,in_RDX,in_R9,in_stack_00000008,in_stack_00000010);
  }
  local_a8 = in_RDX;
  if ((in_stack_00000028 & 1) == 0) {
    local_a8 = local_60;
  }
  *local_a8 = '\0';
  return;
}

Assistant:

void bundle_foreach(const struct Port& p, const char* name, char* const old_end,
                    const char* const name_buffer, size_t buffer_size,
                    /* data which is only being used by the ftors */
                    const struct Ports& base,
                    void* const data, void* const runtime, const F& ftor,
                    /* options */
                    const bool expand_bundles = true,
                    const bool cut_afterwards = true,
                    const bool ranges = false)
{
    ssize_t space_left = buffer_size - (ssize_t)(old_end - name_buffer);
#ifdef NDEBUG
    (void)space_left;
#endif
    assert(space_left > 0);
    assert(space_left <= (ssize_t)buffer_size);

    char *pos = old_end;
    while(*name != '#') { assert(space_left); *pos++ = *name++; --space_left; }
    const unsigned max = atoi(name+1);
    const unsigned iterations = (expand_bundles && !ranges) ? max : 1;
    while(isdigit(*++name)) ;

    char* pos2 = pos;

    const char* name_precheck = name;
    while(*name_precheck && *name_precheck != ':')
        name_precheck++;
    assert(space_left > 16 + (ssize_t)(name_precheck - name) + 1);

    for(unsigned i=0; i<iterations; ++i)
    {
        const char* name2_2 = name;
        if (ranges)
            pos2 += snprintf(pos,16,"[0,%d]",max-1);
        else if(expand_bundles)
            pos2 = pos + snprintf(pos,16,"%d",i);

        // append everything behind the '#' (for cases like a#N/b)
        while(*name2_2 && *name2_2 != ':')
            *pos2++ = *name2_2++;
        *pos2 = 0;

        ftor(&p, name_buffer, old_end, base, data, runtime);
    }

    *(cut_afterwards ? old_end : pos2) = 0;
}